

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::init
          (InterCallTestCase *this,EVP_PKEY_CTX *ctx)

{
  StorageType SVar1;
  Context *pCVar2;
  RenderContext *pRVar3;
  bool *pbVar4;
  bool bVar5;
  ContextType ctxType;
  GLuint GVar6;
  mapped_type_conflict *pmVar7;
  ContextInfo *pCVar8;
  ostream *poVar9;
  ShaderProgram *pSVar10;
  pointer pCVar11;
  TestError *pTVar12;
  NotSupportedError *this_00;
  ContextInfo *pCVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  int iVar20;
  bool bVar21;
  ostringstream buf;
  int local_31c;
  value_type local_310;
  string local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2d0;
  Context *local_2c8;
  Context local_2b8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *local_2a0;
  long local_298;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *local_290;
  vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_> *local_288;
  undefined1 local_280 [112];
  ios_base local_210 [8];
  ios_base local_208 [264];
  ProgramSources local_100;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((((!bVar5) && (this->m_useAtomic != false)) && (this->m_storage == STORAGE_IMAGE)) &&
     (bVar5 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_shader_image_atomic"), !bVar5)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_280._0_8_ = local_280 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"Test requires GL_OES_shader_image_atomic extension","");
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_280);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_288 = &this->m_operationPrograms;
  local_280._0_8_ = (value_type)0x0;
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::resize
            (local_288,
             ((long)(this->m_cmds).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_cmds).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             (value_type *)local_280);
  local_280._0_8_ = local_280._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_operationResultStorages,
             ((long)(this->m_cmds).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_cmds).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             (value_type_conflict2 *)local_280);
  pCVar11 = (this->m_cmds).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_cmds).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar11) >> 2) *
          -0x33333333) {
    local_2d0 = &local_100.transformFeedbackVaryings;
    local_2a0 = &local_100.attribLocationBindings;
    local_290 = &this->m_storageIDs;
    local_2b8.m_contextInfo =
         (ContextInfo *)&(this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header;
    lVar15 = 0;
    local_31c = 0;
    do {
      pcVar18 = (char *)(ulong)pCVar11[lVar15].type;
      local_298 = lVar15;
      switch(pcVar18) {
      case (char *)0x0:
        pCVar8 = (ContextInfo *)
                 (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        iVar16 = pCVar11[lVar15].u_cmd.write.targetHandle;
        pCVar13 = local_2b8.m_contextInfo;
        if (pCVar8 == (ContextInfo *)0x0) {
LAB_00490bef:
          GVar6 = genStorage(this,iVar16);
          pmVar7 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_290,&pCVar11[lVar15].u_cmd.readZero.targetHandle);
          *pmVar7 = GVar6;
        }
        else {
          do {
            iVar14 = *(int *)&(pCVar8->m_extensions).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pcVar18 = (char *)pCVar13;
            if (iVar16 <= iVar14) {
              pcVar18 = (char *)pCVar8;
            }
            pCVar8 = (ContextInfo *)
                     (&(pCVar8->m_extensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)[iVar14 < iVar16];
            pCVar13 = (ContextInfo *)pcVar18;
          } while (pCVar8 != (ContextInfo *)0x0);
          if (((ContextInfo *)pcVar18 == local_2b8.m_contextInfo) ||
             (iVar16 < *(int *)&(((ContextInfo *)pcVar18)->m_extensions).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage))
          goto LAB_00490bef;
        }
        iVar16 = pCVar11[lVar15].u_cmd.write.seed;
        bVar5 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar5 = (bVar5 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar19 = SSBOArrayLengthTests::init::arraysSized + 1;
        if (bVar5) {
          pcVar19 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar15 = 0;
        if (bVar5) {
          lVar15 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar19,lVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar18 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar18 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=0) ",0xd);
          pcVar19 = "writeonly ";
          pcVar18 = "coherent ";
          if ((ulong)this->m_useAtomic != 0) {
            pcVar19 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar19,10 - (ulong)this->m_useAtomic);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar19 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar19 = "iimage2D";
          }
          lVar15 = 0xd;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar19,(ulong)this->m_formatInteger + 7);
          pcVar19 = " u_imageOut;\n";
LAB_00491fa7:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar19,lVar15);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=0, std430) ",0x1a);
          pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar19 = "float";
          pcVar18 = "int";
          if (this->m_formatInteger != false) {
            pcVar19 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar15 = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar19 = "} sb_out;\n";
          goto LAB_00491fa7;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size    = gl_NumWorkGroups * gl_WorkGroupSize;\n",
                   0x36);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx  = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_BUFFER) {
          if (0 < this->m_perInvocationSize) {
            iVar14 = 0;
            do {
              bVar5 = this->m_useAtomic != false;
              pcVar18 = "\t";
              if (bVar5) {
                pcVar18 = "\tatomicExchange(";
              }
              lVar15 = 1;
              if (bVar5) {
                lVar15 = 0x10;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar18,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_out.values[(groupNdx + ",0x1a);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((MessageBuilder *)local_280,
                                  this->m_invocationGridSize * iVar14 * this->m_invocationGridSize +
                                  iVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (poVar9,this->m_invocationGridSize * this->m_invocationGridSize *
                                         this->m_perInvocationSize);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]",1);
              if (this->m_useAtomic == true) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,", ",2);
                pcVar19 = "float";
                pcVar18 = "int";
                if (this->m_formatInteger != false) {
                  pcVar19 = "int";
                }
                lVar15 = 0xd;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
                pcVar19 = "(groupNdx));\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280," = ",3);
                pcVar19 = "float";
                pcVar18 = "int";
                if (this->m_formatInteger != false) {
                  pcVar19 = "int";
                }
                lVar15 = 0xc;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
                pcVar19 = "(groupNdx);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar19,lVar15);
              iVar14 = iVar14 + 1;
            } while (iVar14 < this->m_perInvocationSize);
          }
        }
        else if ((this->m_storage == STORAGE_IMAGE) && (0 < this->m_perInvocationSize)) {
          iVar14 = 0;
          do {
            pcVar19 = "\timageStore";
            pcVar18 = "\timageAtomicExchange";
            if ((ulong)this->m_useAtomic != 0) {
              pcVar19 = "\timageAtomicExchange";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,pcVar19,(ulong)this->m_useAtomic * 9 + 0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,"(u_imageOut, ivec2((int(gl_GlobalInvocationID.x) + ",
                       0x33);
            poVar9 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,", int(gl_GlobalInvocationID.y) + ",0x21);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize * iVar14)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"), ",3);
            bVar5 = this->m_formatInteger;
            if (this->m_useAtomic == true) {
              pcVar19 = "float";
              pcVar18 = "int";
              if (bVar5 != false) {
                pcVar19 = "int";
              }
              lVar17 = 0xd;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar19,(ulong)(bVar5 ^ 1) * 2 + 3);
              pcVar19 = "(groupNdx));\n";
            }
            else {
              pcVar19 = "vec4(float(groupNdx), 0.0, 0.0, 0.0)";
              if (bVar5 != false) {
                pcVar19 = "ivec4(int(groupNdx), 0, 0, 0)";
              }
              lVar15 = 0x24;
              if (bVar5 != false) {
                lVar15 = 0x1d;
              }
              lVar17 = 3;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar19,lVar15);
              pcVar19 = ");\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar19,lVar17);
            iVar14 = iVar14 + 1;
            iVar16 = iVar16 + 100;
          } while (iVar14 < this->m_perInvocationSize);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar10 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        memset(&local_100,0,0xac);
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        std::__cxx11::stringbuf::str();
        (anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_2f0,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar18);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,local_2f0._M_dataplus._M_p,
                   local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + 5,&local_310);
        glu::ShaderProgram::ShaderProgram(pSVar10,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar15 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar15));
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base(local_210);
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar10);
        if ((pSVar10->m_program).m_info.linkOk == false) {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_280 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar12,(string *)local_280);
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        goto LAB_00493586;
      case (char *)0x1:
        iVar16 = pCVar11[lVar15].u_cmd.write.seed;
        bVar5 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar5 = (bVar5 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
        if (bVar5) {
          pcVar18 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar15 = 0;
        if (bVar5) {
          lVar15 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,lVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar18 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar18 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=1) ",0xd);
          pcVar18 = "readonly ";
          if (this->m_useAtomic != false) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar18 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar18 = "iimage2D";
          }
          lVar15 = 0xc;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_formatInteger + 7);
          pcVar18 = " u_imageIn;\n";
LAB_00492259:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,lVar15);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=1, std430) ",0x1a);
          pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar18 = "float";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar15 = 9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar18 = "} sb_in;\n";
          goto LAB_00492259;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout(binding=0, std430) buffer ResultBuffer\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\thighp int resultOk[];\n",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"} sb_result;\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t",1);
        pcVar18 = "float";
        if (this->m_formatInteger != false) {
          pcVar18 = "int";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280," zero = ",8);
        pcVar19 = "0.0";
        pcVar18 = "0";
        if (this->m_formatInteger != false) {
          pcVar19 = "0";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tbool allOk = true;\n",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_BUFFER) {
          if (0 < this->m_perInvocationSize) {
            iVar14 = 0;
            do {
              if (this->m_useAtomic == false) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,"\tallOk = allOk && (sb_in.values[(groupNdx + ",0x2c
                          );
                poVar9 = (ostream *)
                         std::ostream::operator<<
                                   ((MessageBuilder *)local_280,
                                    this->m_invocationGridSize * iVar14 * this->m_invocationGridSize
                                    + iVar16);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
                poVar9 = (ostream *)
                         std::ostream::operator<<
                                   (poVar9,this->m_invocationGridSize * this->m_invocationGridSize *
                                           this->m_perInvocationSize);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] == ",5);
                pcVar19 = "float";
                pcVar18 = "int";
                if (this->m_formatInteger != false) {
                  pcVar19 = "int";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,
                           "\tallOk = allOk && (atomicExchange(sb_in.values[(groupNdx + ",0x3b);
                poVar9 = (ostream *)
                         std::ostream::operator<<
                                   ((MessageBuilder *)local_280,
                                    this->m_invocationGridSize * iVar14 * this->m_invocationGridSize
                                    + iVar16);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
                poVar9 = (ostream *)
                         std::ostream::operator<<
                                   (poVar9,this->m_invocationGridSize * this->m_invocationGridSize *
                                           this->m_perInvocationSize);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"], zero) == ",0xc);
                pcVar19 = "float";
                pcVar18 = "int";
                if (this->m_formatInteger != false) {
                  pcVar19 = "int";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(groupNdx));\n",0xd);
              iVar14 = iVar14 + 1;
            } while (iVar14 < this->m_perInvocationSize);
          }
        }
        else if ((this->m_storage == STORAGE_IMAGE) && (0 < this->m_perInvocationSize)) {
          iVar14 = 0;
          do {
            if (this->m_useAtomic == false) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,
                         "\tallOk = allOk && (imageLoad(u_imageIn, ivec2((gl_GlobalInvocationID.x + "
                         ,0x49);
              poVar9 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u) % ",5);
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"u, gl_GlobalInvocationID.y + ",0x1d);
              poVar9 = (ostream *)
                       std::ostream::operator<<(poVar9,this->m_invocationGridSize * iVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u)).x == ",9);
              pcVar19 = "float";
              pcVar18 = "int";
              if (this->m_formatInteger != false) {
                pcVar19 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,
                         "\tallOk = allOk && (imageAtomicExchange(u_imageIn, ivec2((gl_GlobalInvocationID.x + "
                         ,0x53);
              poVar9 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u) % ",5);
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"u, gl_GlobalInvocationID.y + ",0x1d);
              poVar9 = (ostream *)
                       std::ostream::operator<<(poVar9,this->m_invocationGridSize * iVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u), zero) == ",0xd);
              pcVar19 = "float";
              pcVar18 = "int";
              if (this->m_formatInteger != false) {
                pcVar19 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(groupNdx));\n",0xd);
            iVar14 = iVar14 + 1;
            iVar16 = iVar16 + 100;
          } while (iVar14 < this->m_perInvocationSize);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n",
                   0x35);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar10 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        memset(&local_100,0,0xac);
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        std::__cxx11::stringbuf::str();
        (anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_2f0,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar18);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,local_2f0._M_dataplus._M_p,
                   local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + 5,&local_310);
        glu::ShaderProgram::ShaderProgram(pSVar10,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar15 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar15));
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base(local_210);
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar10);
        if ((pSVar10->m_program).m_info.linkOk == false) {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_280 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar12,(string *)local_280);
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        break;
      default:
        goto switchD_00490bb1_caseD_2;
      case (char *)0x3:
        iVar16 = pCVar11[lVar15].u_cmd.write.seed;
        iVar14 = pCVar11[lVar15].u_cmd.readMulti.seed1;
        bVar5 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar5 = (bVar5 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
        if (bVar5) {
          pcVar18 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar15 = 0;
        if (bVar5) {
          lVar15 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,lVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar18 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar18 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=1) ",0xd);
          pcVar18 = "readonly ";
          if (this->m_useAtomic != false) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar18 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar18 = "iimage2D";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_formatInteger + 7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," u_imageIn0;\n",0xd);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar18 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar18 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=2) ",0xd);
          pcVar18 = "readonly ";
          if (this->m_useAtomic != false) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar18 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar18 = "iimage2D";
          }
          lVar15 = 0xd;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_formatInteger + 7);
          pcVar18 = " u_imageIn1;\n";
LAB_00491717:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,lVar15);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=1, std430) ",0x1a);
          pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer0\n",0xf);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar18 = "float";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"} sb_in0;\n",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=2, std430) ",0x1a);
          pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer1\n",0xf);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar18 = "float";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar15 = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar18 = "} sb_in1;\n";
          goto LAB_00491717;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout(binding=0, std430) buffer ResultBuffer\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\thighp int resultOk[];\n",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"} sb_result;\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t",1);
        pcVar18 = "float";
        if (this->m_formatInteger != false) {
          pcVar18 = "int";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280," zero = ",8);
        pcVar19 = "0.0";
        pcVar18 = "0";
        if (this->m_formatInteger != false) {
          pcVar19 = "0";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tbool allOk = true;\n",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_BUFFER) {
          if (0 < this->m_perInvocationSize) {
            iVar20 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\tallOk = allOk && (",0x13);
              bVar5 = this->m_useAtomic != false;
              pbVar4 = SSBOArrayLengthTests::init::arraysSized;
              if (bVar5) {
                pbVar4 = (bool *)"\tatomicExchange(";
              }
              lVar15 = 0;
              if (bVar5) {
                lVar15 = 0xf;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pbVar4 + 1,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_in0.values[(groupNdx + ",0x1a);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((MessageBuilder *)local_280,
                                  this->m_invocationGridSize * iVar20 * this->m_invocationGridSize +
                                  iVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (poVar9,this->m_invocationGridSize * this->m_invocationGridSize *
                                         this->m_perInvocationSize);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]",1);
              bVar5 = this->m_useAtomic != false;
              pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
              if (bVar5) {
                pcVar18 = ", zero)";
              }
              lVar15 = 0;
              if (bVar5) {
                lVar15 = 7;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," == ",4);
              pcVar18 = "float";
              if (this->m_formatInteger != false) {
                pcVar18 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(groupNdx));\n",0xd);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\tallOk = allOk && (",0x13)
              ;
              bVar5 = this->m_useAtomic != false;
              pbVar4 = SSBOArrayLengthTests::init::arraysSized;
              if (bVar5) {
                pbVar4 = (bool *)"\tatomicExchange(";
              }
              lVar15 = 0;
              if (bVar5) {
                lVar15 = 0xf;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pbVar4 + 1,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"sb_in1.values[(groupNdx + ",0x1a);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (poVar9,this->m_invocationGridSize * iVar20 *
                                         this->m_invocationGridSize + iVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (poVar9,this->m_invocationGridSize * this->m_invocationGridSize *
                                         this->m_perInvocationSize);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]",1);
              bVar5 = this->m_useAtomic != false;
              pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
              if (bVar5) {
                pcVar18 = ", zero)";
              }
              lVar15 = 0;
              if (bVar5) {
                lVar15 = 7;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," == ",4);
              pcVar19 = "float";
              pcVar18 = "int";
              if (this->m_formatInteger != false) {
                pcVar19 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(groupNdx));\n",0xd);
              iVar20 = iVar20 + 1;
            } while (iVar20 < this->m_perInvocationSize);
          }
        }
        else if ((this->m_storage == STORAGE_IMAGE) && (0 < this->m_perInvocationSize)) {
          iVar20 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,"\tallOk = allOk && (",0x13);
            bVar5 = this->m_useAtomic != false;
            pcVar18 = "imageLoad";
            if (bVar5) {
              pcVar18 = "imageAtomicExchange";
            }
            lVar15 = 9;
            if (bVar5) {
              lVar15 = 0x13;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,lVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,"(u_imageIn0, ivec2((gl_GlobalInvocationID.x + ",0x2e);
            poVar9 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u) % ",5);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"u, gl_GlobalInvocationID.y + ",0x1d);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize * iVar20)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u)",2);
            pcVar18 = ").x";
            if (this->m_useAtomic != false) {
              pcVar18 = ", zero)";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,pcVar18,(ulong)this->m_useAtomic * 4 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," == ",4);
            pcVar18 = "float";
            if (this->m_formatInteger != false) {
              pcVar18 = "int";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(groupNdx));\n",0xd);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\tallOk = allOk && (",0x13);
            bVar5 = this->m_useAtomic != false;
            pcVar18 = "imageLoad";
            if (bVar5) {
              pcVar18 = "imageAtomicExchange";
            }
            lVar15 = 9;
            if (bVar5) {
              lVar15 = 0x13;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"(u_imageIn1, ivec2((gl_GlobalInvocationID.x + ",0x2e);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u) % ",5);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"u, gl_GlobalInvocationID.y + ",0x1d);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize * iVar20)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u)",2);
            pcVar18 = ").x";
            if (this->m_useAtomic != false) {
              pcVar18 = ", zero)";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,pcVar18,(ulong)this->m_useAtomic * 4 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," == ",4);
            pcVar19 = "float";
            pcVar18 = "int";
            if (this->m_formatInteger != false) {
              pcVar19 = "int";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(groupNdx));\n",0xd);
            iVar20 = iVar20 + 1;
            iVar14 = iVar14 + 100;
            iVar16 = iVar16 + 100;
          } while (iVar20 < this->m_perInvocationSize);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n",
                   0x35);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar10 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        memset(&local_100,0,0xac);
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        std::__cxx11::stringbuf::str();
        (anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_2f0,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar18);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,local_2f0._M_dataplus._M_p,
                   local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + 5,&local_310);
        glu::ShaderProgram::ShaderProgram(pSVar10,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar15 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar15));
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base(local_210);
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar10);
        if ((pSVar10->m_program).m_info.linkOk == false) {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_280 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar12,(string *)local_280);
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        break;
      case (char *)0x4:
        pCVar8 = (ContextInfo *)
                 (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        iVar16 = pCVar11[lVar15].u_cmd.write.targetHandle;
        pCVar13 = local_2b8.m_contextInfo;
        if (pCVar8 == (ContextInfo *)0x0) {
LAB_004912c2:
          GVar6 = genStorage(this,iVar16);
          pmVar7 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_290,&pCVar11[lVar15].u_cmd.readZero.targetHandle);
          *pmVar7 = GVar6;
        }
        else {
          do {
            iVar14 = *(int *)&(pCVar8->m_extensions).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pcVar18 = (char *)pCVar13;
            if (iVar16 <= iVar14) {
              pcVar18 = (char *)pCVar8;
            }
            pCVar8 = (ContextInfo *)
                     (&(pCVar8->m_extensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)[iVar14 < iVar16];
            pCVar13 = (ContextInfo *)pcVar18;
          } while (pCVar8 != (ContextInfo *)0x0);
          if (((ContextInfo *)pcVar18 == local_2b8.m_contextInfo) ||
             (iVar16 < *(int *)&(((ContextInfo *)pcVar18)->m_extensions).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage))
          goto LAB_004912c2;
        }
        iVar16 = pCVar11[lVar15].u_cmd.write.seed;
        bVar5 = pCVar11[lVar15].u_cmd.writeInterleave.evenOdd;
        bVar21 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar21 = (bVar21 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar19 = SSBOArrayLengthTests::init::arraysSized + 1;
        if (bVar21) {
          pcVar19 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar15 = 0;
        if (bVar21) {
          lVar15 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar19,lVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar18 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar18 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=0) ",0xd);
          pcVar19 = "writeonly ";
          pcVar18 = "coherent ";
          if ((ulong)this->m_useAtomic != 0) {
            pcVar19 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar19,10 - (ulong)this->m_useAtomic);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar19 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar19 = "iimage2D";
          }
          lVar15 = 0xd;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar19,(ulong)this->m_formatInteger + 7);
          pcVar19 = " u_imageOut;\n";
LAB_0049265d:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar19,lVar15);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=0, std430) ",0x1a);
          pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar19 = "float";
          pcVar18 = "int";
          if (this->m_formatInteger != false) {
            pcVar19 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar15 = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar19 = "} sb_out;\n";
          goto LAB_0049265d;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size    = gl_NumWorkGroups * gl_WorkGroupSize;\n",
                   0x36);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx  = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_BUFFER) {
          if (0 < this->m_perInvocationSize) {
            iVar14 = 0;
            do {
              bVar21 = this->m_useAtomic != false;
              pcVar18 = "\t";
              if (bVar21) {
                pcVar18 = "\tatomicExchange(";
              }
              lVar15 = 1;
              if (bVar21) {
                lVar15 = 0x10;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar18,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_out.values[((groupNdx + ",0x1b);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((MessageBuilder *)local_280,
                                  (this->m_invocationGridSize * iVar14 * this->m_invocationGridSize)
                                  / 2 + iVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (poVar9,((this->m_invocationGridSize * this->m_invocationGridSize)
                                         / 2) * this->m_perInvocationSize);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") * 2 + ",8);
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(bVar5 ^ 1));
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]",1);
              if (this->m_useAtomic == true) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,", ",2);
                pcVar19 = "float";
                pcVar18 = "int";
                if (this->m_formatInteger != false) {
                  pcVar19 = "int";
                }
                lVar15 = 0xd;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
                pcVar19 = "(groupNdx));\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"= ",2);
                pcVar19 = "float";
                pcVar18 = "int";
                if (this->m_formatInteger != false) {
                  pcVar19 = "int";
                }
                lVar15 = 0xc;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
                pcVar19 = "(groupNdx);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar19,lVar15);
              iVar14 = iVar14 + 1;
            } while (iVar14 < this->m_perInvocationSize);
          }
        }
        else if ((this->m_storage == STORAGE_IMAGE) && (0 < this->m_perInvocationSize)) {
          iVar14 = 0;
          do {
            pcVar19 = "\timageStore";
            pcVar18 = "\timageAtomicExchange";
            if ((ulong)this->m_useAtomic != 0) {
              pcVar19 = "\timageAtomicExchange";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,pcVar19,(ulong)this->m_useAtomic * 9 + 0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,"(u_imageOut, ivec2(((int(gl_GlobalInvocationID.x) + ",
                       0x34);
            poVar9 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize / 2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") * 2 + ",8);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(bVar5 ^ 1));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,", int(gl_GlobalInvocationID.y) + ",0x21);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize * iVar14)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"), ",3);
            bVar21 = this->m_formatInteger;
            if (this->m_useAtomic == true) {
              pcVar19 = "float";
              pcVar18 = "int";
              if (bVar21 != false) {
                pcVar19 = "int";
              }
              lVar17 = 0xd;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar19,(ulong)(bVar21 ^ 1) * 2 + 3);
              pcVar19 = "(groupNdx));\n";
            }
            else {
              pcVar19 = "vec4(float(groupNdx), 0.0, 0.0, 0.0)";
              if (bVar21 != false) {
                pcVar19 = "ivec4(int(groupNdx), 0, 0, 0)";
              }
              lVar15 = 0x24;
              if (bVar21 != false) {
                lVar15 = 0x1d;
              }
              lVar17 = 3;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar19,lVar15);
              pcVar19 = ");\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar19,lVar17);
            iVar14 = iVar14 + 1;
            iVar16 = iVar16 + 100;
          } while (iVar14 < this->m_perInvocationSize);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar10 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        memset(&local_100,0,0xac);
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        std::__cxx11::stringbuf::str();
        (anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_2f0,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar18);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,local_2f0._M_dataplus._M_p,
                   local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + 5,&local_310);
        glu::ShaderProgram::ShaderProgram(pSVar10,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar15 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar15));
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base(local_210);
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar10);
        if ((pSVar10->m_program).m_info.linkOk == false) {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_280 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar12,(string *)local_280);
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
LAB_00493586:
        local_31c = local_31c + 1;
        (local_288->super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>)
        ._M_impl.super__Vector_impl_data._M_start[local_298] = pSVar10;
        goto switchD_00490bb1_caseD_2;
      case (char *)0x5:
        iVar16 = pCVar11[lVar15].u_cmd.write.seed;
        iVar14 = pCVar11[lVar15].u_cmd.readMulti.targetHandle1;
        bVar5 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar5 = (bVar5 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
        if (bVar5) {
          pcVar18 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar15 = 0;
        if (bVar5) {
          lVar15 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,lVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar18 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar18 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=1) ",0xd);
          pcVar18 = "readonly ";
          if (this->m_useAtomic != false) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar18 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar18 = "iimage2D";
          }
          lVar15 = 0xc;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_formatInteger + 7);
          pcVar18 = " u_imageIn;\n";
LAB_00492942:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,lVar15);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=1, std430) ",0x1a);
          pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar18 = "float";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar15 = 9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar18 = "} sb_in;\n";
          goto LAB_00492942;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout(binding=0, std430) buffer ResultBuffer\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\thighp int resultOk[];\n",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"} sb_result;\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint interleavedGroupNdx = int((size.x >> 1U) * size.y * gl_GlobalInvocationID.z + (size.x >> 1U) * gl_GlobalInvocationID.y + (gl_GlobalInvocationID.x >> 1U));\n"
                   ,0xa0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t",1);
        pcVar18 = "float";
        if (this->m_formatInteger != false) {
          pcVar18 = "int";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280," zero = ",8);
        pcVar19 = "0.0";
        pcVar18 = "0";
        if (this->m_formatInteger != false) {
          pcVar19 = "0";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tbool allOk = true;\n",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"\tif (groupNdx % 2 == 0)\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t{\n",3);
          if (0 < this->m_perInvocationSize) {
            iVar20 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\t\tallOk = allOk && (",0x14);
              bVar5 = this->m_useAtomic != false;
              pcVar18 = "imageLoad";
              if (bVar5) {
                pcVar18 = "imageAtomicExchange";
              }
              lVar15 = 9;
              if (bVar5) {
                lVar15 = 0x13;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar18,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,
                         "(u_imageIn, ivec2(((int(gl_GlobalInvocationID.x >> 1U) + ",0x39);
              poVar9 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize / 2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,") * 2 + 0, int(gl_GlobalInvocationID.y) + ",0x2a);
              poVar9 = (ostream *)
                       std::ostream::operator<<(poVar9,this->m_invocationGridSize * iVar20);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
              pcVar18 = ").x";
              if (this->m_useAtomic != false) {
                pcVar18 = ", zero)";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar18,(ulong)this->m_useAtomic * 4 + 3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," == ",4);
              pcVar19 = "float";
              pcVar18 = "int";
              if (this->m_formatInteger != false) {
                pcVar19 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"(interleavedGroupNdx));\n",0x18);
              iVar20 = iVar20 + 1;
              iVar16 = iVar16 + 100;
            } while (iVar20 < this->m_perInvocationSize);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t}\n",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\telse\n",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t{\n",3);
          if (0 < this->m_perInvocationSize) {
            iVar16 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\t\tallOk = allOk && (",0x14);
              bVar5 = this->m_useAtomic != false;
              pcVar18 = "imageLoad";
              if (bVar5) {
                pcVar18 = "imageAtomicExchange";
              }
              lVar15 = 9;
              if (bVar5) {
                lVar15 = 0x13;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar18,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,
                         "(u_imageIn, ivec2(((int(gl_GlobalInvocationID.x >> 1U) + ",0x39);
              poVar9 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_invocationGridSize / 2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,") * 2 + 1, int(gl_GlobalInvocationID.y) + ",0x2a);
              poVar9 = (ostream *)
                       std::ostream::operator<<(poVar9,this->m_invocationGridSize * iVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
              pcVar18 = ").x";
              if (this->m_useAtomic != false) {
                pcVar18 = ", zero)";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar18,(ulong)this->m_useAtomic * 4 + 3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," == ",4);
              pcVar19 = "float";
              pcVar18 = "int";
              if (this->m_formatInteger != false) {
                pcVar19 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"(interleavedGroupNdx));\n",0x18);
              iVar16 = iVar16 + 1;
              iVar14 = iVar14 + 100;
            } while (iVar16 < this->m_perInvocationSize);
          }
LAB_00494003:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t}\n",3);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"\tif (groupNdx % 2 == 0)\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t{\n",3);
          if (0 < this->m_perInvocationSize) {
            iVar20 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\t\tallOk = allOk && (",0x14);
              bVar5 = this->m_useAtomic != false;
              pbVar4 = SSBOArrayLengthTests::init::arraysSized;
              if (bVar5) {
                pbVar4 = (bool *)"\tatomicExchange(";
              }
              lVar15 = 0;
              if (bVar5) {
                lVar15 = 0xf;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pbVar4 + 1,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_in.values[((interleavedGroupNdx + ",0x25);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((MessageBuilder *)local_280,
                                  (this->m_invocationGridSize * iVar20 * this->m_invocationGridSize)
                                  / 2 + iVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (poVar9,(this->m_invocationGridSize * this->m_invocationGridSize *
                                         this->m_perInvocationSize) / 2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") * 2 + 0]",10);
              bVar5 = this->m_useAtomic != false;
              pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
              if (bVar5) {
                pcVar18 = ", zero)";
              }
              lVar15 = 0;
              if (bVar5) {
                lVar15 = 7;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," == ",4);
              pcVar19 = "float";
              pcVar18 = "int";
              if (this->m_formatInteger != false) {
                pcVar19 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"(interleavedGroupNdx));\n",0x18);
              iVar20 = iVar20 + 1;
            } while (iVar20 < this->m_perInvocationSize);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t}\n",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\telse\n",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t{\n",3);
          if (0 < this->m_perInvocationSize) {
            iVar16 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\t\tallOk = allOk && (",0x14);
              bVar5 = this->m_useAtomic != false;
              pbVar4 = SSBOArrayLengthTests::init::arraysSized;
              if (bVar5) {
                pbVar4 = (bool *)"\tatomicExchange(";
              }
              lVar15 = 0;
              if (bVar5) {
                lVar15 = 0xf;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pbVar4 + 1,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_in.values[((interleavedGroupNdx + ",0x25);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((MessageBuilder *)local_280,
                                  (this->m_invocationGridSize * iVar16 * this->m_invocationGridSize)
                                  / 2 + iVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") % ",4);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (poVar9,(this->m_invocationGridSize * this->m_invocationGridSize *
                                         this->m_perInvocationSize) / 2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") * 2 + 1]",10);
              bVar5 = this->m_useAtomic != false;
              pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
              if (bVar5) {
                pcVar18 = ", zero)";
              }
              lVar15 = 0;
              if (bVar5) {
                lVar15 = 7;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," == ",4);
              pcVar19 = "float";
              pcVar18 = "int";
              if (this->m_formatInteger != false) {
                pcVar19 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"(interleavedGroupNdx));\n",0x18);
              iVar16 = iVar16 + 1;
            } while (iVar16 < this->m_perInvocationSize);
          }
          goto LAB_00494003;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n",
                   0x35);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar10 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        memset(&local_100,0,0xac);
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        std::__cxx11::stringbuf::str();
        (anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_2f0,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar18);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,local_2f0._M_dataplus._M_p,
                   local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + 5,&local_310);
        glu::ShaderProgram::ShaderProgram(pSVar10,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar15 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar15));
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base(local_210);
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar10);
        if ((pSVar10->m_program).m_info.linkOk == false) {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_280 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar12,(string *)local_280);
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        break;
      case (char *)0x6:
        pCVar8 = (ContextInfo *)
                 (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        iVar16 = pCVar11[lVar15].u_cmd.write.targetHandle;
        pCVar13 = local_2b8.m_contextInfo;
        if (pCVar8 == (ContextInfo *)0x0) {
LAB_00490fc6:
          GVar6 = genStorage(this,iVar16);
          pmVar7 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_290,&pCVar11[lVar15].u_cmd.readZero.targetHandle);
          *pmVar7 = GVar6;
        }
        else {
          do {
            iVar14 = *(int *)&(pCVar8->m_extensions).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (iVar16 <= iVar14) {
              pCVar13 = pCVar8;
            }
            pCVar8 = (ContextInfo *)
                     (&(pCVar8->m_extensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)[iVar14 < iVar16];
          } while (pCVar8 != (ContextInfo *)0x0);
          if ((pCVar13 == local_2b8.m_contextInfo) ||
             (iVar16 < *(int *)&(pCVar13->m_extensions).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage))
          goto LAB_00490fc6;
        }
        bVar5 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar5 = (bVar5 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
        if (bVar5) {
          pcVar18 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar15 = 0;
        if (bVar5) {
          lVar15 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,lVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar18 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar18 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=1) ",0xd);
          pcVar18 = "readonly ";
          if (this->m_useAtomic != false) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar18 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar18 = "iimage2D";
          }
          lVar15 = 0xc;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_formatInteger + 7);
          pcVar18 = " u_imageIn;\n";
LAB_00491c26:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,lVar15);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=1, std430) ",0x1a);
          pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar18 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar18 = "float";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar15 = 9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar18 = "} sb_in;\n";
          goto LAB_00491c26;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout(binding=0, std430) buffer ResultBuffer\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\thighp int resultOk[];\n",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"} sb_result;\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t",1);
        pcVar18 = "float";
        if (this->m_formatInteger != false) {
          pcVar18 = "int";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar18,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280," anything = ",0xc);
        pcVar19 = "5.0";
        pcVar18 = "5";
        if (this->m_formatInteger != false) {
          pcVar19 = "5";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tbool allOk = true;\n",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_BUFFER) {
          if (0 < this->m_perInvocationSize) {
            iVar16 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\tallOk = allOk && (",0x13);
              bVar5 = this->m_useAtomic != false;
              pbVar4 = SSBOArrayLengthTests::init::arraysSized;
              if (bVar5) {
                pbVar4 = (bool *)"\tatomicExchange(";
              }
              lVar15 = 0;
              if (bVar5) {
                lVar15 = 0xf;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pbVar4 + 1,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_in.values[groupNdx * ",0x18);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((MessageBuilder *)local_280,this->m_perInvocationSize);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," + ",3);
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]",1);
              bVar5 = this->m_useAtomic != false;
              pcVar18 = SSBOArrayLengthTests::init::arraysSized + 1;
              if (bVar5) {
                pcVar18 = ", anything)";
              }
              lVar15 = 0;
              if (bVar5) {
                lVar15 = 0xb;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18,lVar15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," == ",4);
              pcVar19 = "0.0";
              pcVar18 = "0";
              if (this->m_formatInteger != false) {
                pcVar19 = "0";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
              iVar16 = iVar16 + 1;
            } while (iVar16 < this->m_perInvocationSize);
          }
        }
        else if ((this->m_storage == STORAGE_IMAGE) && (0 < this->m_perInvocationSize)) {
          iVar16 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,"\tallOk = allOk && (",0x13);
            bVar5 = this->m_useAtomic != false;
            pcVar18 = "imageLoad";
            if (bVar5) {
              pcVar18 = "imageAtomicExchange";
            }
            lVar15 = 9;
            if (bVar5) {
              lVar15 = 0x13;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar18,lVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,
                       "(u_imageIn, ivec2(gl_GlobalInvocationID.x, gl_GlobalInvocationID.y + ",0x45)
            ;
            poVar9 = (ostream *)
                     std::ostream::operator<<
                               ((MessageBuilder *)local_280,this->m_invocationGridSize * iVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"u)",2);
            pcVar18 = ").x";
            if (this->m_useAtomic != false) {
              pcVar18 = ", anything)";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,pcVar18,(ulong)this->m_useAtomic * 8 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," == ",4);
            pcVar19 = "0.0";
            pcVar18 = "0";
            if (this->m_formatInteger != false) {
              pcVar19 = "0";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,pcVar19,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
            iVar16 = iVar16 + 1;
          } while (iVar16 < this->m_perInvocationSize);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n",
                   0x35);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar10 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        memset(&local_100,0,0xac);
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        std::__cxx11::stringbuf::str();
        (anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_2f0,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar18);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,local_2f0._M_dataplus._M_p,
                   local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + 5,&local_310);
        glu::ShaderProgram::ShaderProgram(pSVar10,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar15 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar15));
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base(local_210);
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar10);
        if ((pSVar10->m_program).m_info.linkOk == false) {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_280 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar12,(string *)local_280);
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
      lVar15 = local_298;
      local_31c = local_31c + 1;
      (this->m_operationPrograms).
      super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
      super__Vector_impl_data._M_start[local_298] = pSVar10;
      GVar6 = genResultStorage(this);
      (this->m_operationResultStorages).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar15] = GVar6;
      local_298 = lVar15;
switchD_00490bb1_caseD_2:
      lVar15 = local_298 + 1;
      pCVar11 = (this->m_cmds).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar15 < (int)((ulong)((long)(this->m_cmds).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar11
                                   ) >> 2) * -0x33333333);
  }
  return (int)pCVar11;
}

Assistant:

void InterCallTestCase::init (void)
{
	int			programFriendlyName = 0;
	const bool	supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (m_useAtomic && m_storage == STORAGE_IMAGE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
		throw tcu::NotSupportedError("Test requires GL_OES_shader_image_atomic extension");

	// generate resources and validate command list

	m_operationPrograms.resize(m_cmds.size(), DE_NULL);
	m_operationResultStorages.resize(m_cmds.size(), 0);

	for (int step = 0; step < (int)m_cmds.size(); ++step)
	{
		switch (m_cmds[step].type)
		{
			case InterCallOperations::Command::TYPE_WRITE:
			{
				const op::WriteData& cmd = m_cmds[step].u_cmd.write;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genWriteProgram(cmd.seed);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ:
			{
				const op::ReadData& cmd = m_cmds[step].u_cmd.read;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle) != m_storageIDs.end());

				// program and result storage
				{
					glu::ShaderProgram* program = genReadProgram(cmd.seed);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_BARRIER:
			{
				break;
			}

			case InterCallOperations::Command::TYPE_READ_MULTIPLE:
			{
				const op::ReadMultipleData& cmd = m_cmds[step].u_cmd.readMulti;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle0) != m_storageIDs.end());
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle1) != m_storageIDs.end());

				// program
				{
					glu::ShaderProgram* program = genReadMultipleProgram(cmd.seed0, cmd.seed1);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_WRITE_INTERLEAVE:
			{
				const op::WriteDataInterleaved& cmd = m_cmds[step].u_cmd.writeInterleave;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genWriteInterleavedProgram(cmd.seed, cmd.evenOdd);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ_INTERLEAVE:
			{
				const op::ReadDataInterleaved& cmd = m_cmds[step].u_cmd.readInterleave;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle) != m_storageIDs.end());

				// program
				{
					glu::ShaderProgram* program = genReadInterleavedProgram(cmd.seed0, cmd.seed1);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ_ZERO:
			{
				const op::ReadZeroData& cmd = m_cmds[step].u_cmd.readZero;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genReadZeroProgram();

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}